

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void lest::report(ostream *os,message *e,text *test)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_119;
  long *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  long *local_d8;
  long local_d0;
  undefined1 local_c8;
  uint7 uStack_c7;
  undefined8 uStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  undefined8 uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  undefined8 uStack_80;
  comment local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  int local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,*(long *)(e + 0x30),*(long *)(e + 0x38) + *(long *)(e + 0x30));
  local_38 = *(int *)(e + 0x50);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  local_118 = (long *)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,*(long *)(e + 0x10),*(long *)(e + 0x18) + *(long *)(e + 0x10));
  lVar1 = local_110;
  local_b8 = &local_a8;
  if (local_118 == (long *)&local_108) {
    uStack_a0 = uStack_100;
  }
  else {
    local_b8 = local_118;
  }
  local_a8 = CONCAT71(uStack_107,local_108);
  local_b0 = local_110;
  local_110 = 0;
  local_108 = 0;
  local_118 = (long *)&local_108;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_b8,lVar1);
  local_78.info._M_dataplus._M_p = (pointer)&local_78.info.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,*(long *)(e + 0x58),*(long *)(e + 0x60) + *(long *)(e + 0x58));
  poVar2 = operator<<(poVar2,&local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(test->_M_dataplus)._M_p,test->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  pcVar3 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string((string *)&local_d8,pcVar3,&local_119);
  local_90 = local_d0;
  if (local_d8 == (long *)&local_c8) {
    uStack_e0 = uStack_c0;
    local_f8 = &local_e8;
  }
  else {
    local_f8 = local_d8;
  }
  local_e8 = CONCAT71(uStack_c7,local_c8);
  local_d0 = 0;
  local_c8 = 0;
  if (local_f8 == &local_e8) {
    uStack_80 = uStack_e0;
    local_98 = &local_88;
  }
  else {
    local_98 = local_f8;
  }
  local_88 = local_e8;
  local_f0 = 0;
  local_e8 = (ulong)uStack_c7 << 8;
  local_f8 = &local_e8;
  local_d8 = (long *)&local_c8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_98,local_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_d8 != (long *)&local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.info._M_dataplus._M_p != &local_78.info.field_2) {
    operator_delete(local_78.info._M_dataplus._M_p,local_78.info.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_118 != (long *)&local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}